

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::sessionFixtureLogOut_NotLoggedOn_LogoutNotSentHelper::
~sessionFixtureLogOut_NotLoggedOn_LogoutNotSentHelper
          (sessionFixtureLogOut_NotLoggedOn_LogoutNotSentHelper *this)

{
  sessionFixture::~sessionFixture((sessionFixture *)&this[-1].m_details);
  operator_delete(&this[-1].m_details,0x630);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, LogOut_NotLoggedOn_LogoutNotSent) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(0, 0, 31);

  UtcTimeStamp time;
  object->setResponder( this );

  object->logout("test_logout");
  object->next();
  CHECK(!object->sentLogout());
}